

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void triplet_to_planar(uint8_t *triplet_buffer,uint8_t *planar_buffer,size_t width,size_t height,
                      size_t stride)

{
  long lVar1;
  size_t column;
  size_t pixel;
  size_t line_start;
  size_t line;
  size_t plane_column;
  size_t byte_count_plane;
  size_t stride_local;
  size_t height_local;
  size_t width_local;
  uint8_t *planar_buffer_local;
  uint8_t *triplet_buffer_local;
  
  line = 0;
  for (line_start = 0; line_start < height; line_start = line_start + 1) {
    for (column = 0; column < width; column = column + 1) {
      lVar1 = line_start * stride + column * 3;
      planar_buffer[line] = triplet_buffer[lVar1];
      planar_buffer[line + width * height] = triplet_buffer[lVar1 + 1];
      planar_buffer[line + width * height * 2] = triplet_buffer[lVar1 + 2];
      line = line + 1;
    }
  }
  return;
}

Assistant:

static void triplet_to_planar(const uint8_t* triplet_buffer, uint8_t* planar_buffer, const size_t width, const size_t height,
                              const size_t stride)
{
    const size_t byte_count_plane = width * height;
    size_t plane_column = 0;

    for (size_t line = 0; line < height; ++line)
    {
        const size_t line_start = line * stride;
        for (size_t pixel = 0; pixel < width; ++pixel)
        {
            const size_t column = line_start + pixel * bytes_per_rgb_pixel;

            planar_buffer[plane_column] = triplet_buffer[column];
            planar_buffer[plane_column + 1 * byte_count_plane] = triplet_buffer[column + 1];
            planar_buffer[plane_column + 2 * byte_count_plane] = triplet_buffer[column + 2];
            ++plane_column;
        }
    }
}